

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O2

void __thiscall
HModel::load_fromArrays
          (HModel *this,int XnumCol,int XobjSense,double *XcolCost,double *XcolLower,
          double *XcolUpper,int XnumRow,double *XrowLower,double *XrowUpper,int XnumNz,int *XAstart,
          int *XAindex,double *XAvalue)

{
  double dVar1;
  
  this->totalTime = 0.0;
  HTimer::reset(&this->timer);
  this->numCol = XnumCol;
  this->numRow = XnumRow;
  this->objSense = XobjSense;
  std::vector<double,std::allocator<double>>::_M_assign_aux<double_const*>
            ((vector<double,std::allocator<double>> *)&this->colCost,XcolCost,XcolCost + XnumCol);
  std::vector<double,std::allocator<double>>::_M_assign_aux<double_const*>
            ((vector<double,std::allocator<double>> *)&this->colLower,XcolLower,
             XcolLower + this->numCol);
  std::vector<double,std::allocator<double>>::_M_assign_aux<double_const*>
            ((vector<double,std::allocator<double>> *)&this->colUpper,XcolUpper,
             XcolUpper + this->numCol);
  std::vector<double,std::allocator<double>>::_M_assign_aux<double_const*>
            ((vector<double,std::allocator<double>> *)&this->rowLower,XrowLower,
             XrowLower + this->numRow);
  std::vector<double,std::allocator<double>>::_M_assign_aux<double_const*>
            ((vector<double,std::allocator<double>> *)&this->rowUpper,XrowUpper,
             XrowUpper + this->numRow);
  std::vector<int,std::allocator<int>>::_M_assign_aux<int_const*>
            ((vector<int,std::allocator<int>> *)&this->Astart,XAstart,
             XAstart + (long)this->numCol + 1);
  std::vector<int,std::allocator<int>>::_M_assign_aux<int_const*>
            ((vector<int,std::allocator<int>> *)&this->Aindex,XAindex,XAindex + XnumNz);
  std::vector<double,std::allocator<double>>::_M_assign_aux<double_const*>
            ((vector<double,std::allocator<double>> *)&this->Avalue,XAvalue,XAvalue + XnumNz);
  this->numTot = this->numRow + this->numCol;
  initScale(this);
  initWithLogicalBasis(this);
  dVar1 = HTimer::getTime(&this->timer);
  this->totalTime = dVar1 + this->totalTime;
  return;
}

Assistant:

void HModel::load_fromArrays(int XnumCol, int XobjSense, const double* XcolCost, const double* XcolLower, const double* XcolUpper,
			     int XnumRow, const double* XrowLower, const double* XrowUpper,
			     int XnumNz, const int* XAstart, const int* XAindex, const double* XAvalue) {
  //  printf("load_fromArrays: XnumCol = %d; XnumRow = %d; XnumNz = %d\n", XnumCol, XnumRow, XnumNz);
  assert(XnumCol > 0);
  assert(XnumRow > 0);

  // Initialise the total runtine for this model
  totalTime = 0;
  // Load the model, timing the process
  timer.reset();

  numCol = XnumCol;
  numRow = XnumRow;
  objSense = XobjSense;
  int numNz = XnumNz;
  colCost.assign(&XcolCost[0], &XcolCost[0] + numCol);
  colLower.assign(&XcolLower[0], &XcolLower[0] + numCol);
  colUpper.assign(&XcolUpper[0], &XcolUpper[0] + numCol);
  rowLower.assign(&XrowLower[0], &XrowLower[0] + numRow);
  rowUpper.assign(&XrowUpper[0], &XrowUpper[0] + numRow);
  Astart.assign(&XAstart[0], &XAstart[0] + numCol + 1);
  Aindex.assign(&XAindex[0], &XAindex[0] + numNz);
  Avalue.assign(&XAvalue[0], &XAvalue[0] + numNz);
  numTot = numCol + numRow;
  
  // Assign and initialise the scaling factors
  initScale();

  // Initialise with a logical basis then allocate and populate (where
  // possible) work* arrays and allocate basis* arrays
  initWithLogicalBasis();

  totalTime += timer.getTime();
}